

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectSubroutineBinding
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **subroutine_names,
          GLchar **uniform_names,bool use_program_query)

{
  code *pcVar1;
  byte bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar7;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar8;
  MessageBuilder local_208;
  GLuint local_84;
  int local_80;
  GLuint routine_index;
  GLint routine;
  GLuint uniform_location;
  GLint uniform;
  uint local_64;
  undefined1 local_60 [4];
  GLuint queried_subroutine_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subroutine_uniforms;
  int local_40;
  GLint n_active_subroutine_uniforms;
  GLint n_active_subroutines;
  bool result;
  Functions *gl;
  GLchar **ppGStack_28;
  bool use_program_query_local;
  GLchar **uniform_names_local;
  GLchar **subroutine_names_local;
  FunctionalTest3_4 *pFStack_10;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  
  gl._7_1_ = use_program_query;
  ppGStack_28 = uniform_names;
  uniform_names_local = subroutine_names;
  subroutine_names_local._4_4_ = program_id;
  pFStack_10 = this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  _n_active_subroutines = CONCAT44(extraout_var,iVar3);
  n_active_subroutine_uniforms._3_1_ = 1;
  local_40 = 0;
  subroutine_uniforms.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  local_64 = 0;
  (**(code **)(_n_active_subroutines + 0x9d0))(subroutine_names_local._4_4_,0x8b31,0x8de5,&local_40)
  ;
  dVar4 = (**(code **)(_n_active_subroutines + 0x800))();
  glu::checkError(dVar4,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe2f);
  (**(code **)(_n_active_subroutines + 0x9d0))
            (subroutine_names_local._4_4_,0x8b31,0x8de6,
             (undefined1 *)
             ((long)&subroutine_uniforms.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  dVar4 = (**(code **)(_n_active_subroutines + 0x800))();
  glu::checkError(dVar4,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe32);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
             (long)subroutine_uniforms.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
  for (routine = 0; bVar2 = n_active_subroutine_uniforms._3_1_,
      routine < subroutine_uniforms.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; routine = routine + 1) {
    routine_index =
         getSubroutineUniformLocation
                   (this,subroutine_names_local._4_4_,ppGStack_28[routine],(bool)(gl._7_1_ & 1));
    for (local_80 = 0; local_80 < local_40; local_80 = local_80 + 1) {
      GVar5 = getSubroutineIndex(this,subroutine_names_local._4_4_,uniform_names_local[local_80],
                                 (bool)(gl._7_1_ & 1));
      local_84 = GVar5;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                          (long)routine);
      iVar3 = subroutine_uniforms.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      *pvVar7 = GVar5;
      pcVar1 = *(code **)(_n_active_subroutines + 0x1668);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,0);
      (*pcVar1)(0x8b31,iVar3,pvVar7);
      dVar4 = (**(code **)(_n_active_subroutines + 0x800))();
      glu::checkError(dVar4,"UniformSubroutinesuiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0xe41);
      (**(code **)(_n_active_subroutines + 0xb50))(0x8b31,routine_index,&local_64);
      dVar4 = (**(code **)(_n_active_subroutines + 0x800))();
      glu::checkError(dVar4,"GetUniformSubroutineuiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0xe44);
      if (local_64 != local_84) {
        this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        this_01 = tcu::TestContext::getLog(this_00);
        tcu::TestLog::operator<<(&local_208,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_208,
                            (char (*) [61])
                            "Error. Invalid result. Function: gl.getUniformSubroutineuiv.");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [22])" Subroutine uniform: ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&routine);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])", name: ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,ppGStack_28 + routine);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])", location: ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&routine_index);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])". Subroutine: ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_80);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])", name: ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,uniform_names_local + local_80);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [10])0x2a25f55);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_84);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [11])0x2a1a404);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_64);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_208);
        n_active_subroutine_uniforms._3_1_ = 0;
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  return (bool)(bVar2 & 1);
}

Assistant:

bool FunctionalTest3_4::inspectSubroutineBinding(GLuint program_id, const GLchar** subroutine_names,
												 const GLchar** uniform_names, bool use_program_query) const
{
	const glw::Functions& gl						   = m_context.getRenderContext().getFunctions();
	bool				  result					   = true;
	GLint				  n_active_subroutines		   = 0;
	GLint				  n_active_subroutine_uniforms = 0;
	std::vector<GLuint>   subroutine_uniforms;
	GLuint				  queried_subroutine_index = 0;

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINES, &n_active_subroutines);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	subroutine_uniforms.resize(n_active_subroutine_uniforms);

	for (GLint uniform = 0; uniform < n_active_subroutine_uniforms; ++uniform)
	{
		GLuint uniform_location = getSubroutineUniformLocation(program_id, uniform_names[uniform], use_program_query);

		for (GLint routine = 0; routine < n_active_subroutines; ++routine)
		{
			GLuint routine_index = getSubroutineIndex(program_id, subroutine_names[routine], use_program_query);

			subroutine_uniforms[uniform] = routine_index;

			gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_active_subroutine_uniforms, &subroutine_uniforms[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

			gl.getUniformSubroutineuiv(GL_VERTEX_SHADER, uniform_location, &queried_subroutine_index);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformSubroutineuiv");

			if (queried_subroutine_index != routine_index)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Error. Invalid result. Function: gl.getUniformSubroutineuiv."
					<< " Subroutine uniform: " << uniform << ", name: " << uniform_names[uniform]
					<< ", location: " << uniform_location << ". Subroutine: " << routine
					<< ", name: " << subroutine_names[routine] << ", index: " << routine_index
					<< ". Result: " << queried_subroutine_index << tcu::TestLog::EndMessage;

				result = false;
			}
		}
	}

	return result;
}